

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionInfo.cpp
# Opt level: O3

PositionInfo __thiscall PositionInfo::operator+(PositionInfo *this,PositionInfo *right)

{
  PositionInfo PVar1;
  
  PVar1.lastLine = right->lastLine;
  PVar1.firstLine = this->firstLine;
  PVar1.lastColumn = right->lastColumn;
  PVar1.firstColumn = this->firstColumn;
  return PVar1;
}

Assistant:

PositionInfo PositionInfo::operator+(const PositionInfo &right) const {
    PositionInfo newPosition;
    newPosition.firstColumn = this->firstColumn;
    newPosition.firstLine = this->firstLine;
    newPosition.lastColumn = right.lastColumn;
    newPosition.lastLine = right.lastLine;
    return newPosition;
}